

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qudpsocket.cpp
# Opt level: O0

QNetworkDatagram __thiscall QUdpSocket::receiveDatagram(QUdpSocket *this,qint64 maxSize)

{
  Data *pDVar1;
  QAbstractSocketEngine *pQVar2;
  bool bVar3;
  SocketError SVar4;
  QUdpSocketPrivate *errorString;
  char *pcVar5;
  long lVar6;
  long in_RDX;
  QNetworkDatagramPrivate *in_RDI;
  long in_FS_OFFSET;
  qint64 readBytes;
  QUdpSocketPrivate *d;
  QNetworkDatagram *result;
  undefined4 in_stack_ffffffffffffff18;
  PacketHeaderOption in_stack_ffffffffffffff1c;
  QByteArray *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined2 uVar7;
  quint16 in_stack_ffffffffffffff2e;
  undefined2 uVar8;
  QMessageLogger *in_stack_ffffffffffffff30;
  QAbstractSocketPrivate *this_00;
  QByteArray *in_stack_ffffffffffffff38;
  QNetworkDatagram *in_stack_ffffffffffffff40;
  long local_80;
  undefined4 local_4c;
  QByteArray local_40;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = d_func((QUdpSocket *)0x2670a7);
  bVar3 = QAbstractSocket::isValid((QAbstractSocket *)in_stack_ffffffffffffff20);
  if (bVar3) {
    local_80 = in_RDX;
    if (in_RDX < 0) {
      local_80 = (**(code **)(*(long *)(errorString->super_QAbstractSocketPrivate).socketEngine +
                             0xf0))();
    }
    if (local_80 < 0) {
      QNetworkDatagram::QNetworkDatagram((QNetworkDatagram *)in_stack_ffffffffffffff38);
    }
    else {
      (in_RDI->data).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(&local_40,local_80,Uninitialized);
      QHostAddress::QHostAddress((QHostAddress *)in_stack_ffffffffffffff20);
      QNetworkDatagram::QNetworkDatagram
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (QHostAddress *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2e);
      QHostAddress::~QHostAddress((QHostAddress *)0x26718e);
      QByteArray::~QByteArray((QByteArray *)0x26719b);
      this_00 = (QAbstractSocketPrivate *)(errorString->super_QAbstractSocketPrivate).socketEngine;
      pcVar5 = QByteArray::data(in_stack_ffffffffffffff20);
      pDVar1 = (in_RDI->data).d.d;
      QFlags<QAbstractSocketEngine::PacketHeaderOption>::QFlags
                ((QFlags<QAbstractSocketEngine::PacketHeaderOption> *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff1c);
      lVar6 = (**(code **)(*(long *)this_00 + 0xf8))
                        (this_00,pcVar5,local_80,&pDVar1[1].super_QArrayData.alloc,local_4c);
      (errorString->super_QAbstractSocketPrivate).hasPendingData = false;
      (errorString->super_QAbstractSocketPrivate).hasPendingDatagram = false;
      pQVar2 = (errorString->super_QAbstractSocketPrivate).socketEngine;
      (**(code **)(*(long *)pQVar2 + 0x140))(pQVar2,1);
      if (lVar6 < 0) {
        SVar4 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x26726d);
        uVar7 = (undefined2)SVar4;
        uVar8 = (undefined2)((uint)SVar4 >> 0x10);
        QAbstractSocketEngine::errorString
                  ((QAbstractSocketEngine *)
                   CONCAT26(uVar8,CONCAT24(uVar7,in_stack_ffffffffffffff28)));
        QAbstractSocketPrivate::setErrorAndEmit
                  (this_00,CONCAT22(uVar8,uVar7),(QString *)errorString);
        QString::~QString((QString *)0x2672ad);
      }
      QByteArray::truncate((longlong)(in_RDI->data).d.d);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff30,
               (char *)CONCAT26(in_stack_ffffffffffffff2e,
                                CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
               (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::warning
              (local_28,
               "QUdpSocket::receiveDatagram() called on a QUdpSocket when not in QUdpSocket::BoundState"
              );
    QNetworkDatagram::QNetworkDatagram((QNetworkDatagram *)in_stack_ffffffffffffff38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QNetworkDatagram)in_RDI;
}

Assistant:

QNetworkDatagram QUdpSocket::receiveDatagram(qint64 maxSize)
{
    Q_D(QUdpSocket);

#if defined QUDPSOCKET_DEBUG
    qDebug("QUdpSocket::receiveDatagram(%lld)", maxSize);
#endif
    QT_CHECK_BOUND("QUdpSocket::receiveDatagram()", QNetworkDatagram());

    if (maxSize < 0)
        maxSize = d->socketEngine->pendingDatagramSize();
    if (maxSize < 0)
        return QNetworkDatagram();

    QNetworkDatagram result(QByteArray(maxSize, Qt::Uninitialized));
    qint64 readBytes = d->socketEngine->readDatagram(result.d->data.data(), maxSize, &result.d->header,
                                                     QAbstractSocketEngine::WantAll);
    d->hasPendingData = false;
    d->hasPendingDatagram = false;
    d->socketEngine->setReadNotificationEnabled(true);
    if (readBytes < 0) {
        d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
        readBytes = 0;
    }

    result.d->data.truncate(readBytes);
    return result;
}